

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableMergeDrawChannels(ImGuiTable *table)

{
  ImVec2 *pIVar1;
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImVector<ImDrawCmd> IVar6;
  char cVar7;
  char cVar8;
  byte bVar9;
  ImDrawCmd *pIVar10;
  ImDrawChannel *pIVar11;
  undefined1 (*pauVar12) [16];
  undefined1 auVar13 [12];
  undefined8 uVar14;
  ImGuiContext *pIVar15;
  bool bVar16;
  int n;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  ImDrawChannel *pIVar20;
  long lVar21;
  ImVector<ImDrawCmd> *pIVar22;
  char *__function;
  undefined4 extraout_EDX;
  int iVar23;
  ulong uVar24;
  uint uVar25;
  float *pfVar26;
  long lVar27;
  ImGuiTableColumn *pIVar28;
  int iVar29;
  byte bVar30;
  uint uVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined4 uVar37;
  ImBitArray<132> remaining_mask;
  ImBitArray<132> *local_150;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  ImBitArray<132> local_128;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  float local_d8 [2];
  undefined8 uStack_d0;
  int iStack_c8;
  ImBitArray<132> local_c4 [7];
  
  pIVar15 = GImGui;
  if ((table->DrawSplitter)._Current != 0) {
    __assert_fail("splitter->_Current == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                  ,0x88e,"void ImGui::TableMergeDrawChannels(ImGuiTable *)");
  }
  cVar7 = table->FreezeRowsCount;
  cVar8 = table->FreezeColumnsCount;
  uVar25 = 0;
  memset(local_d8,0,0xa0);
  iVar17 = table->ColumnsCount;
  if (0 < iVar17) {
    uVar24 = 0;
    do {
      if ((table->VisibleMaskByIndex >> (uVar24 & 0x3f) & 1) != 0) {
        pIVar28 = (table->Columns).Data + uVar24;
        if ((table->Columns).DataEnd <= pIVar28) {
          __assert_fail("p >= Data && p < DataEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_internal.h"
                        ,0x20c,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]"
                       );
        }
        uVar31 = 1;
        do {
          bVar30 = (byte)uVar31;
          bVar9 = *(byte *)((long)&pIVar28->Flags + ((ulong)uVar31 ^ 0x59));
          if ((table->DrawSplitter)._Channels.Size <= (int)(uint)bVar9) goto LAB_0019028e;
          pIVar20 = (table->DrawSplitter)._Channels.Data;
          iVar17 = pIVar20[bVar9]._CmdBuffer.Size;
          if (0 < (long)iVar17) {
            pIVar20 = pIVar20 + bVar9;
            if ((pIVar20->_CmdBuffer).Data[(long)iVar17 + -1].ElemCount == 0) {
              iVar17 = iVar17 + -1;
              (pIVar20->_CmdBuffer).Size = iVar17;
            }
            if (iVar17 == 1) {
              if ((pIVar28->Flags & 0x100) == 0) {
                if (cVar7 < '\x01') {
                  fVar3 = pIVar28->ContentMaxXUnfrozen;
LAB_0018fcd0:
                  uVar31 = -(uint)(pIVar28->ContentMaxXHeadersUsed <= fVar3);
                  fVar3 = (float)(~uVar31 & (uint)pIVar28->ContentMaxXHeadersUsed |
                                 (uint)fVar3 & uVar31);
                }
                else {
                  if (bVar30 != 0) {
                    fVar3 = pIVar28->ContentMaxXFrozen;
                    goto LAB_0018fcd0;
                  }
                  fVar3 = pIVar28->ContentMaxXUnfrozen;
                }
                pIVar1 = &(pIVar28->ClipRect).Max;
                if (pIVar1->x <= fVar3 && fVar3 != pIVar1->x) goto LAB_0018fdee;
              }
              if (cVar8 < '\x01') {
                uVar31 = 1;
              }
              else {
                uVar31 = (uint)((long)table->FreezeColumnsCount <= (long)uVar24);
              }
              uVar18 = ((byte)~bVar30 & 1) * 2;
              if (cVar7 < '\x01') {
                uVar18 = 2;
              }
              if (0x83 < bVar9) {
                __assert_fail("channel_no < (4 + 64 * 2)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                              ,0x8be,"void ImGui::TableMergeDrawChannels(ImGuiTable *)");
              }
              uVar19 = (ulong)(uVar31 | uVar18);
              pfVar26 = local_d8 + uVar19 * 10;
              if ((&iStack_c8)[uVar19 * 10] == 0) {
                pfVar26[0] = 3.4028235e+38;
                pfVar26[1] = 3.4028235e+38;
                (&uStack_d0)[uVar19 * 5] = 0xff7fffffff7fffff;
              }
              ImBitArray<132>::SetBit(local_c4 + uVar19 * 2,(uint)bVar9);
              (&iStack_c8)[uVar19 * 10] = (&iStack_c8)[uVar19 * 10] + 1;
              if ((pIVar20->_CmdBuffer).Size < 1) {
                __function = "T &ImVector<ImDrawCmd>::operator[](int) [T = ImDrawCmd]";
                goto LAB_001902a3;
              }
              pIVar10 = (pIVar20->_CmdBuffer).Data;
              fVar3 = (pIVar10->ClipRect).x;
              fVar4 = (pIVar10->ClipRect).y;
              fVar32 = (pIVar10->ClipRect).z;
              fVar5 = (pIVar10->ClipRect).w;
              if (fVar3 < *pfVar26) {
                *pfVar26 = fVar3;
              }
              if (fVar4 < local_d8[uVar19 * 10 + 1]) {
                local_d8[uVar19 * 10 + 1] = fVar4;
              }
              if (*(float *)(&uStack_d0 + uVar19 * 5) <= fVar32 &&
                  fVar32 != *(float *)(&uStack_d0 + uVar19 * 5)) {
                *(float *)(&uStack_d0 + uVar19 * 5) = fVar32;
              }
              pfVar26 = (float *)((long)&uStack_d0 + uVar19 * 0x28 + 4);
              if (*pfVar26 <= fVar5 && fVar5 != *pfVar26) {
                *(float *)((long)&uStack_d0 + uVar19 * 0x28 + 4) = fVar5;
              }
              uVar25 = uVar25 | 1 << (uVar31 | uVar18);
            }
          }
LAB_0018fdee:
          uVar31 = 0;
        } while (('\0' < cVar7 & bVar30) != 0);
        pIVar28->DrawChannelCurrent = 0xff;
        iVar17 = table->ColumnsCount;
      }
      uVar24 = uVar24 + 1;
    } while ((long)uVar24 < (long)iVar17);
    if (uVar25 != 0) {
      iVar23 = (table->DrawSplitter)._Count;
      iVar17 = iVar23 + -2;
      iVar29 = (pIVar15->DrawChannelsTempMergeBuffer).Capacity;
      if (iVar29 < iVar17) {
        if (iVar29 == 0) {
          iVar29 = 8;
        }
        else {
          iVar29 = iVar29 / 2 + iVar29;
        }
        if (iVar29 <= iVar17) {
          iVar29 = iVar17;
        }
        pIVar20 = (ImDrawChannel *)MemAlloc((long)iVar29 << 5);
        pIVar11 = (pIVar15->DrawChannelsTempMergeBuffer).Data;
        if (pIVar11 != (ImDrawChannel *)0x0) {
          memcpy(pIVar20,pIVar11,(long)(pIVar15->DrawChannelsTempMergeBuffer).Size << 5);
          MemFree((pIVar15->DrawChannelsTempMergeBuffer).Data);
        }
        (pIVar15->DrawChannelsTempMergeBuffer).Data = pIVar20;
        (pIVar15->DrawChannelsTempMergeBuffer).Capacity = iVar29;
        iVar23 = (table->DrawSplitter)._Count;
      }
      else {
        pIVar20 = (pIVar15->DrawChannelsTempMergeBuffer).Data;
      }
      (pIVar15->DrawChannelsTempMergeBuffer).Size = iVar17;
      local_128.Storage[0] = 0;
      local_128.Storage[1] = 0;
      local_128.Storage[2] = 0;
      local_128.Storage[3] = 0;
      local_128.Storage[4] = 0;
      ImBitArray<132>::SetBitRange(&local_128,2,iVar23 + -1);
      ImBitArray<132>::ClearBit(&local_128,(uint)table->Bg2DrawChannelUnfrozen);
      if (cVar7 < '\x01') {
        iVar17 = -2;
      }
      else {
        iVar17 = -3;
        if (table->Bg2DrawChannelUnfrozen == '\x01') {
          __assert_fail("has_freeze_v == false || table->Bg2DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG2_FROZEN"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                        ,0x8ea,"void ImGui::TableMergeDrawChannels(ImGuiTable *)");
        }
      }
      iVar17 = iVar17 + (table->DrawSplitter)._Count;
      fVar3 = (table->HostClipRect).Min.x;
      fVar4 = (table->HostClipRect).Min.y;
      local_f8 = ZEXT416((uint)(table->HostClipRect).Max.x);
      local_108 = ZEXT416((uint)(table->HostClipRect).Max.y);
      local_150 = local_c4;
      uVar24 = 0;
      do {
        iVar29 = (&iStack_c8)[uVar24 * 10];
        if (iVar29 != 0) {
          auVar34 = *(undefined1 (*) [16])(local_d8 + uVar24 * 10);
          if ((uVar24 & 1) == 0 || cVar8 < '\x01') {
            auVar33 = auVar34;
            if (fVar3 <= auVar34._0_4_) {
              auVar33._4_12_ = auVar34._4_12_;
              auVar33._0_4_ = fVar3;
            }
            auVar34._0_4_ = auVar33._0_4_;
          }
          if (uVar24 < 2 || cVar7 < '\x01') {
            fVar32 = auVar34._4_4_;
            if (fVar4 <= auVar34._4_4_) {
              fVar32 = fVar4;
            }
            uVar37 = auVar34._0_4_;
            auVar34._4_4_ = fVar32;
            auVar34._0_4_ = uVar37;
          }
          if ((uVar24 & 1) != 0) {
            uVar25 = -(uint)((float)local_f8._0_4_ <= auVar34._8_4_);
            auVar34._8_4_ = ~uVar25 & local_f8._0_4_ | (uint)auVar34._8_4_ & uVar25;
          }
          if ((1 < uVar24) && ((table->Flags & 0x10000) == 0)) {
            uVar25 = -(uint)((float)local_108._0_4_ <= auVar34._12_4_);
            auVar34._12_4_ = ~uVar25 & local_108._0_4_ | (uint)auVar34._12_4_ & uVar25;
          }
          lVar21 = 0;
          do {
            local_128.Storage[lVar21] = local_128.Storage[lVar21] & ~local_150->Storage[lVar21];
            lVar21 = lVar21 + 1;
          } while (lVar21 != 5);
          iVar17 = iVar17 - iVar29;
          if (0 < (table->DrawSplitter)._Count) {
            lVar21 = 0;
            lVar27 = 0;
            local_e8 = auVar34;
            do {
              bVar16 = ImBitArray<132>::TestBit(local_c4 + uVar24 * 2,(int)lVar27);
              if (bVar16) {
                ImBitArray<132>::ClearBit(local_c4 + uVar24 * 2,(int)lVar27);
                if ((table->DrawSplitter)._Channels.Size <= lVar27) goto LAB_0019028e;
                pIVar11 = (table->DrawSplitter)._Channels.Data;
                if (*(int *)((long)&(pIVar11->_CmdBuffer).Size + lVar21) != 1) {
LAB_001902ad:
                  __assert_fail("channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect))"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                                ,0x915,"void ImGui::TableMergeDrawChannels(ImGuiTable *)");
                }
                pauVar12 = *(undefined1 (**) [16])((long)&(pIVar11->_CmdBuffer).Data + lVar21);
                auVar33 = *pauVar12;
                local_138 = auVar34._0_4_;
                fStack_134 = auVar34._4_4_;
                fStack_130 = auVar34._8_4_;
                fStack_12c = auVar34._12_4_;
                auVar36._4_4_ = -(uint)(fStack_134 <= auVar33._4_4_);
                auVar36._0_4_ = -(uint)(local_138 <= auVar33._0_4_);
                auVar13._4_8_ = auVar33._8_8_;
                auVar13._0_4_ = -(uint)(auVar33._4_4_ <= fStack_134);
                auVar35._0_8_ = auVar13._0_8_ << 0x20;
                auVar35._8_4_ = -(uint)(auVar33._8_4_ <= fStack_130);
                auVar35._12_4_ = -(uint)(auVar33._12_4_ <= fStack_12c);
                auVar36._8_8_ = auVar35._8_8_;
                iVar23 = movmskps(extraout_EDX,auVar36);
                if (iVar23 != 0xf) goto LAB_001902ad;
                iVar29 = iVar29 + -1;
                pIVar22 = (ImVector<ImDrawCmd> *)((long)&(pIVar11->_CmdBuffer).Size + lVar21);
                *(undefined8 *)*pauVar12 = local_e8._0_8_;
                *(undefined8 *)(*pauVar12 + 8) = local_e8._8_8_;
                IVar6 = *pIVar22;
                iVar23 = pIVar22[1].Capacity;
                pIVar10 = pIVar22[1].Data;
                (pIVar20->_IdxBuffer).Size = pIVar22[1].Size;
                (pIVar20->_IdxBuffer).Capacity = iVar23;
                (pIVar20->_IdxBuffer).Data = (unsigned_short *)pIVar10;
                pIVar20->_CmdBuffer = IVar6;
                pIVar20 = pIVar20 + 1;
              }
              lVar27 = lVar27 + 1;
            } while ((lVar27 < (table->DrawSplitter)._Count) &&
                    (lVar21 = lVar21 + 0x20, iVar29 != 0));
          }
        }
        if (uVar24 == 1 && '\0' < cVar7) {
          bVar9 = table->Bg2DrawChannelUnfrozen;
          if ((table->DrawSplitter)._Channels.Size <= (int)(uint)bVar9) goto LAB_0019028e;
          pIVar11 = (table->DrawSplitter)._Channels.Data;
          IVar6 = pIVar11[bVar9]._CmdBuffer;
          pIVar20->_IdxBuffer = pIVar11[bVar9]._IdxBuffer;
          pIVar20->_CmdBuffer = IVar6;
          pIVar20 = pIVar20 + 1;
        }
        uVar24 = uVar24 + 1;
        local_150 = local_150 + 2;
      } while (uVar24 != 4);
      iVar29 = (table->DrawSplitter)._Count;
      if ((0 < iVar29) && (iVar17 != 0)) {
        lVar27 = 0;
        lVar21 = 0;
        do {
          bVar16 = ImBitArray<132>::TestBit(&local_128,(int)lVar21);
          if (bVar16) {
            if ((table->DrawSplitter)._Channels.Size <= lVar21) {
LAB_0019028e:
              __function = "T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]";
LAB_001902a3:
              __assert_fail("i >= 0 && i < Size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.h"
                            ,0x658,__function);
            }
            pIVar11 = (table->DrawSplitter)._Channels.Data;
            puVar2 = (undefined8 *)((long)&(pIVar11->_CmdBuffer).Size + lVar27);
            uVar14 = *puVar2;
            pIVar10 = (ImDrawCmd *)puVar2[1];
            pIVar20->_IdxBuffer =
                 *(ImVector<unsigned_short> *)((long)&(pIVar11->_IdxBuffer).Size + lVar27);
            (pIVar20->_CmdBuffer).Size = (int)uVar14;
            (pIVar20->_CmdBuffer).Capacity = (int)((ulong)uVar14 >> 0x20);
            (pIVar20->_CmdBuffer).Data = pIVar10;
            pIVar20 = pIVar20 + 1;
            iVar17 = iVar17 + -1;
          }
          lVar21 = lVar21 + 1;
          iVar29 = (table->DrawSplitter)._Count;
        } while ((lVar21 < iVar29) && (lVar27 = lVar27 + 0x20, iVar17 != 0));
      }
      pIVar11 = (pIVar15->DrawChannelsTempMergeBuffer).Data;
      if (pIVar20 != pIVar11 + (pIVar15->DrawChannelsTempMergeBuffer).Size) {
        __assert_fail("dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                      ,0x929,"void ImGui::TableMergeDrawChannels(ImGuiTable *)");
      }
      memcpy((table->DrawSplitter)._Channels.Data + 2,pIVar11,(long)iVar29 * 0x20 - 0x40);
    }
  }
  return;
}

Assistant:

void ImGui::TableMergeDrawChannels(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImDrawListSplitter* splitter = &table->DrawSplitter;
    const bool has_freeze_v = (table->FreezeRowsCount > 0);
    const bool has_freeze_h = (table->FreezeColumnsCount > 0);
    IM_ASSERT(splitter->_Current == 0);

    // Track which groups we are going to attempt to merge, and which channels goes into each group.
    struct MergeGroup
    {
        ImRect  ClipRect;
        int     ChannelsCount;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> ChannelsMask;
    };
    int merge_group_mask = 0x00;
    MergeGroup merge_groups[4];
    memset(merge_groups, 0, sizeof(merge_groups));

    // 1. Scan channels and take note of those which can be merged
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if ((table->VisibleMaskByIndex & ((ImU64)1 << column_n)) == 0)
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const int merge_group_sub_count = has_freeze_v ? 2 : 1;
        for (int merge_group_sub_n = 0; merge_group_sub_n < merge_group_sub_count; merge_group_sub_n++)
        {
            const int channel_no = (merge_group_sub_n == 0) ? column->DrawChannelFrozen : column->DrawChannelUnfrozen;

            // Don't attempt to merge if there are multiple draw calls within the column
            ImDrawChannel* src_channel = &splitter->_Channels[channel_no];
            if (src_channel->_CmdBuffer.Size > 0 && src_channel->_CmdBuffer.back().ElemCount == 0)
                src_channel->_CmdBuffer.pop_back();
            if (src_channel->_CmdBuffer.Size != 1)
                continue;

            // Find out the width of this merge group and check if it will fit in our column
            // (note that we assume that rendering didn't stray on the left direction. we should need a CursorMinPos to detect it)
            if (!(column->Flags & ImGuiTableColumnFlags_NoClip))
            {
                float content_max_x;
                if (!has_freeze_v)
                    content_max_x = ImMax(column->ContentMaxXUnfrozen, column->ContentMaxXHeadersUsed); // No row freeze
                else if (merge_group_sub_n == 0)
                    content_max_x = ImMax(column->ContentMaxXFrozen, column->ContentMaxXHeadersUsed);   // Row freeze: use width before freeze
                else
                    content_max_x = column->ContentMaxXUnfrozen;                                        // Row freeze: use width after freeze
                if (content_max_x > column->ClipRect.Max.x)
                    continue;
            }

            const int merge_group_n = (has_freeze_h && column_n < table->FreezeColumnsCount ? 0 : 1) + (has_freeze_v && merge_group_sub_n == 0 ? 0 : 2);
            IM_ASSERT(channel_no < IMGUI_TABLE_MAX_DRAW_CHANNELS);
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                merge_group->ClipRect = ImRect(+FLT_MAX, +FLT_MAX, -FLT_MAX, -FLT_MAX);
            merge_group->ChannelsMask.SetBit(channel_no);
            merge_group->ChannelsCount++;
            merge_group->ClipRect.Add(src_channel->_CmdBuffer[0].ClipRect);
            merge_group_mask |= (1 << merge_group_n);
        }

        // Invalidate current draw channel
        // (we don't clear DrawChannelFrozen/DrawChannelUnfrozen solely to facilitate debugging/later inspection of data)
        column->DrawChannelCurrent = (ImGuiTableDrawChannelIdx)-1;
    }

    // [DEBUG] Display merge groups
#if 0
    if (g.IO.KeyShift)
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                continue;
            char buf[32];
            ImFormatString(buf, 32, "MG%d:%d", merge_group_n, merge_group->ChannelsCount);
            ImVec2 text_pos = merge_group->ClipRect.Min + ImVec2(4, 4);
            ImVec2 text_size = CalcTextSize(buf, NULL);
            GetForegroundDrawList()->AddRectFilled(text_pos, text_pos + text_size, IM_COL32(0, 0, 0, 255));
            GetForegroundDrawList()->AddText(text_pos, IM_COL32(255, 255, 0, 255), buf, NULL);
            GetForegroundDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 255, 0, 255));
        }
#endif

    // 2. Rewrite channel list in our preferred order
    if (merge_group_mask != 0)
    {
        // We skip channel 0 (Bg0/Bg1) and 1 (Bg2 frozen) from the shuffling since they won't move - see channels allocation in TableSetupDrawChannels().
        const int LEADING_DRAW_CHANNELS = 2;
        g.DrawChannelsTempMergeBuffer.resize(splitter->_Count - LEADING_DRAW_CHANNELS); // Use shared temporary storage so the allocation gets amortized
        ImDrawChannel* dst_tmp = g.DrawChannelsTempMergeBuffer.Data;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> remaining_mask;                       // We need 132-bit of storage
        remaining_mask.ClearBits();
        remaining_mask.SetBitRange(LEADING_DRAW_CHANNELS, splitter->_Count - 1);
        remaining_mask.ClearBit(table->Bg2DrawChannelUnfrozen);
        IM_ASSERT(has_freeze_v == false || table->Bg2DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG2_FROZEN);
        int remaining_count = splitter->_Count - (has_freeze_v ? LEADING_DRAW_CHANNELS + 1 : LEADING_DRAW_CHANNELS);
        //ImRect host_rect = (table->InnerWindow == table->OuterWindow) ? table->InnerClipRect : table->HostClipRect;
        ImRect host_rect = table->HostClipRect;
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            if (int merge_channels_count = merge_groups[merge_group_n].ChannelsCount)
            {
                MergeGroup* merge_group = &merge_groups[merge_group_n];
                ImRect merge_clip_rect = merge_group->ClipRect;

                // Extend outer-most clip limits to match those of host, so draw calls can be merged even if
                // outer-most columns have some outer padding offsetting them from their parent ClipRect.
                // The principal cases this is dealing with are:
                // - On a same-window table (not scrolling = single group), all fitting columns ClipRect -> will extend and match host ClipRect -> will merge
                // - Columns can use padding and have left-most ClipRect.Min.x and right-most ClipRect.Max.x != from host ClipRect -> will extend and match host ClipRect -> will merge
                // FIXME-TABLE FIXME-WORKRECT: We are wasting a merge opportunity on tables without scrolling if column doesn't fit
                // within host clip rect, solely because of the half-padding difference between window->WorkRect and window->InnerClipRect.
                if ((merge_group_n & 1) == 0 || !has_freeze_h)
                    merge_clip_rect.Min.x = ImMin(merge_clip_rect.Min.x, host_rect.Min.x);
                if ((merge_group_n & 2) == 0 || !has_freeze_v)
                    merge_clip_rect.Min.y = ImMin(merge_clip_rect.Min.y, host_rect.Min.y);
                if ((merge_group_n & 1) != 0)
                    merge_clip_rect.Max.x = ImMax(merge_clip_rect.Max.x, host_rect.Max.x);
                if ((merge_group_n & 2) != 0 && (table->Flags & ImGuiTableFlags_NoHostExtendY) == 0)
                    merge_clip_rect.Max.y = ImMax(merge_clip_rect.Max.y, host_rect.Max.y);
#if 0
                GetOverlayDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 0, 0, 200), 0.0f, ~0, 1.0f);
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Min, merge_clip_rect.Min, IM_COL32(255, 100, 0, 200));
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Max, merge_clip_rect.Max, IM_COL32(255, 100, 0, 200));
#endif
                remaining_count -= merge_group->ChannelsCount;
                for (int n = 0; n < IM_ARRAYSIZE(remaining_mask.Storage); n++)
                    remaining_mask.Storage[n] &= ~merge_group->ChannelsMask.Storage[n];
                for (int n = 0; n < splitter->_Count && merge_channels_count != 0; n++)
                {
                    // Copy + overwrite new clip rect
                    if (!merge_group->ChannelsMask.TestBit(n))
                        continue;
                    merge_group->ChannelsMask.ClearBit(n);
                    merge_channels_count--;

                    ImDrawChannel* channel = &splitter->_Channels[n];
                    IM_ASSERT(channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect)));
                    channel->_CmdBuffer[0].ClipRect = merge_clip_rect.ToVec4();
                    memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
                }
            }

            // Make sure Bg2DrawChannelUnfrozen appears in the middle of our groups (whereas Bg0/Bg1 and Bg2 frozen are fixed to 0 and 1)
            if (merge_group_n == 1 && has_freeze_v)
                memcpy(dst_tmp++, &splitter->_Channels[table->Bg2DrawChannelUnfrozen], sizeof(ImDrawChannel));
        }

        // Append unmergeable channels that we didn't reorder at the end of the list
        for (int n = 0; n < splitter->_Count && remaining_count != 0; n++)
        {
            if (!remaining_mask.TestBit(n))
                continue;
            ImDrawChannel* channel = &splitter->_Channels[n];
            memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
            remaining_count--;
        }
        IM_ASSERT(dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size);
        memcpy(splitter->_Channels.Data + LEADING_DRAW_CHANNELS, g.DrawChannelsTempMergeBuffer.Data, (splitter->_Count - LEADING_DRAW_CHANNELS) * sizeof(ImDrawChannel));
    }
}